

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O2

void cf2_stack_pushFixed(CF2_Stack stack,CF2_F16Dot16 val)

{
  CF2_StackNumber *pCVar1;
  int *piVar2;
  
  if (stack->top == stack->buffer + stack->stackSize) {
    piVar2 = stack->error;
    if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
      *piVar2 = 0x82;
    }
  }
  else {
    (stack->top->u).r = val;
    pCVar1 = stack->top;
    pCVar1->type = CF2_NumberFixed;
    stack->top = pCVar1 + 1;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_stack_pushFixed( CF2_Stack  stack,
                       CF2_Fixed  val )
  {
    if ( stack->top == stack->buffer + stack->stackSize )
    {
      CF2_SET_ERROR( stack->error, Stack_Overflow );
      return;     /* stack overflow */
    }

    stack->top->u.r  = val;
    stack->top->type = CF2_NumberFixed;
    stack->top++;
  }